

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::ChromeCompositorStateMachine::Serialize
          (ChromeCompositorStateMachine *this,Message *msg)

{
  bool bVar1;
  ChromeCompositorStateMachine_MajorState *this_00;
  ChromeCompositorStateMachine_MinorState *this_01;
  Message *pMVar2;
  void *data;
  size_t size;
  Message *msg_local;
  ChromeCompositorStateMachine *this_local;
  
  bVar1 = std::bitset<3UL>::operator[](&this->_has_field_,1);
  if (bVar1) {
    this_00 = protozero::CopyablePtr<perfetto::protos::gen::ChromeCompositorStateMachine_MajorState>
              ::operator*(&this->major_state_);
    pMVar2 = protozero::Message::BeginNestedMessage<protozero::Message>(msg,1);
    ChromeCompositorStateMachine_MajorState::Serialize(this_00,pMVar2);
  }
  bVar1 = std::bitset<3UL>::operator[](&this->_has_field_,2);
  if (bVar1) {
    this_01 = protozero::CopyablePtr<perfetto::protos::gen::ChromeCompositorStateMachine_MinorState>
              ::operator*(&this->minor_state_);
    pMVar2 = protozero::Message::BeginNestedMessage<protozero::Message>(msg,2);
    ChromeCompositorStateMachine_MinorState::Serialize(this_01,pMVar2);
  }
  data = (void *)::std::__cxx11::string::data();
  size = ::std::__cxx11::string::size();
  protozero::Message::AppendRawProtoBytes(msg,data,size);
  return;
}

Assistant:

void ChromeCompositorStateMachine::Serialize(::protozero::Message* msg) const {
  // Field 1: major_state
  if (_has_field_[1]) {
    (*major_state_).Serialize(msg->BeginNestedMessage<::protozero::Message>(1));
  }

  // Field 2: minor_state
  if (_has_field_[2]) {
    (*minor_state_).Serialize(msg->BeginNestedMessage<::protozero::Message>(2));
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}